

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::push_back(backtracer *this,log_msg *msg)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffe50;
  log_msg_buffer *in_stack_fffffffffffffe58;
  circular_q<spdlog::details::log_msg_buffer> *in_stack_fffffffffffffe60;
  log_msg *in_stack_fffffffffffffea8;
  log_msg_buffer *in_stack_fffffffffffffeb0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffe50,in_RDI);
  log_msg_buffer::log_msg_buffer(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  circular_q<spdlog::details::log_msg_buffer>::push_back
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  log_msg_buffer::~log_msg_buffer((log_msg_buffer *)0x20df8c);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20df99);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::push_back(const log_msg &msg)
{
    std::lock_guard<std::mutex> lock{mutex_};
    messages_.push_back(log_msg_buffer{msg});
}